

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O2

void __thiscall SynthStateMonitor::allocatePartialsData(SynthStateMonitor *this)

{
  uint uVar1;
  QGridLayout *pQVar2;
  PartialState *pPVar3;
  Bit8u *pBVar4;
  PartialStateLEDWidget **ppPVar5;
  PartialStateLEDWidget *this_00;
  QWidget *parent;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = this->partialCount;
  uVar6 = (ulong)uVar1;
  pPVar3 = (PartialState *)operator_new__(uVar6 * 4);
  this->partialStates = pPVar3;
  pBVar4 = (Bit8u *)operator_new__(uVar6);
  this->keysOfPlayingNotes = pBVar4;
  pBVar4 = (Bit8u *)operator_new__(uVar6);
  this->velocitiesOfPlayingNotes = pBVar4;
  ppPVar5 = (PartialStateLEDWidget **)operator_new__(uVar6 * 8);
  this->partialStateLED = ppPVar5;
  for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
    this_00 = (PartialStateLEDWidget *)operator_new(0x30);
    pQVar2 = (this->ui->super_Ui_SynthWidget).partialStateGrid;
    parent = (QWidget *)(**(code **)(*(long *)(pQVar2 + 0x10) + 0x68))(pQVar2 + 0x10);
    PartialStateLEDWidget::PartialStateLEDWidget(this_00,parent);
    this->partialStateLED[uVar7] = this_00;
    QWidget::setFixedSize((int)this->partialStateLED[uVar7],0x10);
    uVar6 = (ulong)(uVar1 + 7 >> 3);
    QGridLayout::addWidget
              ((this->ui->super_Ui_SynthWidget).partialStateGrid,this->partialStateLED[uVar7],
               (uVar7 & 0xffffffff) / uVar6,(uVar7 & 0xffffffff) % uVar6,0);
    uVar6 = (ulong)this->partialCount;
  }
  return;
}

Assistant:

void SynthStateMonitor::allocatePartialsData() {
	partialStates = new PartialState[partialCount];
	keysOfPlayingNotes = new Bit8u[partialCount];
	velocitiesOfPlayingNotes = new Bit8u[partialCount];

	partialStateLED = new PartialStateLEDWidget*[partialCount];
	uint partialColumnWidth = (partialCount + 7) / 8;
	for (uint i = 0; i < partialCount; i++) {
		partialStateLED[i] = new PartialStateLEDWidget(ui->partialStateGrid->widget());
		partialStateLED[i]->setFixedSize(16, 16);
		ui->partialStateGrid->addWidget(partialStateLED[i], i / partialColumnWidth, i % partialColumnWidth);
	}
}